

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Reader * capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                   (Reader *__return_storage_ptr__,PointerReader reader,StructSchema schema)

{
  StructSchema SVar1;
  DebugExpression<bool> local_49;
  StructSchema schema_local;
  Fault f;
  void *local_30;
  uint local_20;
  
  schema_local = schema;
  Schema::getProto((Reader *)&f,&schema_local.super_Schema);
  SVar1 = schema_local;
  if ((0xe0 < local_20) &&
     (local_49.value = (bool)(*(byte *)((long)local_30 + 0x1c) & 1 ^ 1),
     (*(byte *)((long)local_30 + 0x1c) & 1) != 0)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x770,FAILED,"!schema.getProto().getStruct().getIsGroup()",
               "_kjCondition,\"Cannot form pointer to group type.\"",&local_49,
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal(&f);
  }
  PointerReader::getStruct(&__return_storage_ptr__->reader,&reader,(word *)0x0);
  (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)SVar1.super_Schema.raw;
  return __return_storage_ptr__;
}

Assistant:

DynamicStruct::Reader PointerHelpers<DynamicStruct, Kind::OTHER>::getDynamic(
    PointerReader reader, StructSchema schema) {
  KJ_REQUIRE(!schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  return DynamicStruct::Reader(schema, reader.getStruct(nullptr));
}